

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

value_type
pugi::impl::anon_unknown_0::utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
process<pugi::impl::(anonymous_namespace)::utf8_writer>
          (size_t data,value_type size,value_type result)

{
  uint ch;
  value_type puStack_28;
  uint32_t lead;
  value_type result_local;
  size_t size_local;
  uint32_t *data_local;
  
  puStack_28 = result;
  size_local = data;
  for (result_local = size; result_local != (value_type)0x0; result_local = result_local + -1) {
    ch = *(uint *)size_local;
    if (ch < 0x10000) {
      puStack_28 = utf8_writer::low(puStack_28,ch);
    }
    else {
      puStack_28 = utf8_writer::high(puStack_28,ch);
    }
    size_local = size_local + 4;
  }
  return puStack_28;
}

Assistant:

static inline typename Traits::value_type process(const uint32_t* data, size_t size, typename Traits::value_type result, Traits)
		{
			while (size)
			{
				uint32_t lead = opt_swap::value ? endian_swap(*data) : *data;

				// U+0000..U+FFFF
				if (lead < 0x10000)
				{
					result = Traits::low(result, lead);
					data += 1;
					size -= 1;
				}
				// U+10000..U+10FFFF
				else
				{
					result = Traits::high(result, lead);
					data += 1;
					size -= 1;
				}
			}

			return result;
		}